

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CCEXP.hpp
# Opt level: O2

int __thiscall
CCEXP::CCEXPMat<unsigned_long>::AddValue(CCEXPMat<unsigned_long> *this,unsigned_long val)

{
  pointer pMVar1;
  MVECTOR<unsigned_long> dl;
  MVECTOR<unsigned_long> local_60;
  
  if (this->IgnoreM == false) {
    pMVar1 = (this->data).
             super__Vector_base<ns_MVECTOR::MVECTOR<unsigned_long>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if ((pMVar1 == (this->data).
                   super__Vector_base<ns_MVECTOR::MVECTOR<unsigned_long>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_long>_>_>
                   ._M_impl.super__Vector_impl_data._M_start) || (this->newRowFlag == true)) {
      ns_MVECTOR::MVECTOR<unsigned_long>::MVECTOR(&local_60);
      ns_MVECTOR::MVECTOR<unsigned_long>::clear(&local_60);
      std::
      vector<ns_MVECTOR::MVECTOR<unsigned_long>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_long>_>_>
      ::push_back(&this->data,&local_60);
      this->newRowFlag = false;
      ns_MVECTOR::MVECTOR<unsigned_long>::~MVECTOR(&local_60);
      pMVar1 = (this->data).
               super__Vector_base<ns_MVECTOR::MVECTOR<unsigned_long>,_std::allocator<ns_MVECTOR::MVECTOR<unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    }
    ns_MVECTOR::MVECTOR<unsigned_long>::push_back(pMVar1 + -1,val);
  }
  return 0;
}

Assistant:

int CCEXPMat<T>::AddValue(T val) {
	if (IgnoreM) return 0; // This is not an error - We just ignore the Table...
	const size_t N = data.size();
	if ((N == 0) || (newRowFlag==true)) {
		MVECTOR<T> dl; dl.clear(); data.push_back(dl);
		newRowFlag = false;
	}
	data.back().push_back(val);
	return 0;
}